

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNTchr.cpp
# Opt level: O3

void __thiscall NaPNTeacher::post_action(NaPNTeacher *this)

{
  int iVar1;
  NaPetriCnInput *this_00;
  
  this_00 = &this->errout;
  iVar1 = NaPetriConnector::links(&this_00->super_NaPetriConnector);
  if (iVar1 == 0) {
    NaPetriCnInput::commit_data(&this->desout);
    this_00 = &this->nnout;
  }
  NaPetriCnInput::commit_data(this_00);
  NaPetriCnOutput::commit_data(&this->errinp);
  return;
}

Assistant:

void
NaPNTeacher::post_action ()
{
    if(errout.links() == 0){
        // Input pack #1
        desout.commit_data();
        nnout.commit_data();
    }else{
        // Input pack #2
        errout.commit_data();
    }
    errinp.commit_data();
}